

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall
leveldb::DBImpl::FinishCompactionOutputFile(DBImpl *this,CompactionState *compact,Iterator *input)

{
  void **ppvVar1;
  uint64_t file_number;
  TableBuilder *this_00;
  _func_int **pp_Var2;
  uint64_t uVar3;
  uint64_t file_size;
  _func_int **pp_Var4;
  Iterator *pIVar5;
  long *in_RCX;
  ReadOptions local_48;
  CompactionState *local_38;
  
  local_38 = compact;
  if (input == (Iterator *)0x0) {
    __assert_fail("compact != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x32c,
                  "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)"
                 );
  }
  if (input[1]._vptr_Iterator == (_func_int **)0x0) {
    __assert_fail("compact->outfile != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x32d,
                  "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)"
                 );
  }
  if (input[1].cleanup_head_.function == (CleanupFunction)0x0) {
    __assert_fail("compact->builder != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x32e,
                  "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)"
                 );
  }
  file_number = *(uint64_t *)((long)(input->cleanup_head_).arg2 + -0x50);
  if (file_number != 0) {
    (**(code **)(*in_RCX + 0x50))();
    uVar3 = TableBuilder::NumEntries((TableBuilder *)input[1].cleanup_head_.function);
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      TableBuilder::Finish((TableBuilder *)&local_48);
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_48._0_8_;
      local_48._0_8_ = pp_Var2;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
      }
    }
    else {
      TableBuilder::Abandon((TableBuilder *)input[1].cleanup_head_.function);
    }
    file_size = TableBuilder::FileSize((TableBuilder *)input[1].cleanup_head_.function);
    *(uint64_t *)((long)(input->cleanup_head_).arg2 + -0x48) = file_size;
    ppvVar1 = &input[1].cleanup_head_.arg1;
    *ppvVar1 = (void *)((long)*ppvVar1 + file_size);
    this_00 = (TableBuilder *)input[1].cleanup_head_.function;
    if (this_00 != (TableBuilder *)0x0) {
      TableBuilder::~TableBuilder(this_00);
    }
    operator_delete(this_00);
    input[1].cleanup_head_.function = (CleanupFunction)0x0;
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      (**(code **)(*input[1]._vptr_Iterator + 0x28))(&local_48);
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_48._0_8_;
      pp_Var4 = (_func_int **)local_48._0_8_;
      local_48._0_8_ = pp_Var2;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
        pp_Var4 = (this->super_DB)._vptr_DB;
      }
      if (pp_Var4 == (_func_int **)0x0) {
        (**(code **)(*input[1]._vptr_Iterator + 0x18))(&local_48);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_48._0_8_;
        local_48._0_8_ = pp_Var2;
        if (pp_Var2 != (_func_int **)0x0) {
          operator_delete__(pp_Var2);
        }
      }
    }
    if (input[1]._vptr_Iterator != (_func_int **)0x0) {
      (**(code **)(*input[1]._vptr_Iterator + 8))();
    }
    input[1]._vptr_Iterator = (_func_int **)0x0;
    if ((uVar3 != 0) && ((this->super_DB)._vptr_DB == (_func_int **)0x0)) {
      local_48.snapshot = (Snapshot *)0x0;
      local_48._0_8_ = (_func_int **)0x100;
      pIVar5 = TableCache::NewIterator
                         ((TableCache *)local_38[2].total_bytes,&local_48,file_number,file_size,
                          (Table **)0x0);
      (*pIVar5->_vptr_Iterator[10])(&local_48,pIVar5);
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_48._0_8_;
      local_48._0_8_ = pp_Var2;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
      }
      (*pIVar5->_vptr_Iterator[1])(pIVar5);
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        Log((Logger *)local_38[1].smallest_snapshot,
            "Generated table #%llu@%d: %lld keys, %lld bytes",file_number,
            (ulong)*(uint *)input->_vptr_Iterator,uVar3,file_size);
      }
    }
    return (Status)(char *)this;
  }
  __assert_fail("output_number != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                ,0x331,
                "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)")
  ;
}

Assistant:

Status DBImpl::FinishCompactionOutputFile(CompactionState* compact,
                                          Iterator* input) {
  assert(compact != nullptr);
  assert(compact->outfile != nullptr);
  assert(compact->builder != nullptr);

  const uint64_t output_number = compact->current_output()->number;
  assert(output_number != 0);

  // Check for iterator errors
  Status s = input->status();
  const uint64_t current_entries = compact->builder->NumEntries();
  if (s.ok()) {
    s = compact->builder->Finish();
  } else {
    compact->builder->Abandon();
  }
  const uint64_t current_bytes = compact->builder->FileSize();
  compact->current_output()->file_size = current_bytes;
  compact->total_bytes += current_bytes;
  delete compact->builder;
  compact->builder = nullptr;

  // Finish and check for file errors
  if (s.ok()) {
    s = compact->outfile->Sync();
  }
  if (s.ok()) {
    s = compact->outfile->Close();
  }
  delete compact->outfile;
  compact->outfile = nullptr;

  if (s.ok() && current_entries > 0) {
    // Verify that the table is usable
    Iterator* iter =
        table_cache_->NewIterator(ReadOptions(), output_number, current_bytes);
    s = iter->status();
    delete iter;
    if (s.ok()) {
      Log(options_.info_log, "Generated table #%llu@%d: %lld keys, %lld bytes",
          (unsigned long long)output_number, compact->compaction->level(),
          (unsigned long long)current_entries,
          (unsigned long long)current_bytes);
    }
  }
  return s;
}